

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O1

int tjEncodeYUV3(tjhandle handle,uchar *srcBuf,int width,int pitch,int height,int pixelFormat,
                uchar *dstBuf,int pad,int subsamp)

{
  int iVar1;
  undefined4 extraout_var;
  int iVar2;
  tjinstance *this;
  long in_FS_OFFSET;
  uchar *dstPlanes [3];
  int strides [3];
  uchar *local_58;
  uchar *local_50;
  uchar *puStack_48;
  undefined8 local_40;
  uchar *local_38;
  
  if (handle != (tjhandle)0x0) {
    *(undefined4 *)((long)handle + 0x6d0) = 0;
    if ((pad < 0 || (dstBuf == (uchar *)0x0 || (height < 1 || width < 1))) ||
       ((pad & pad - 1U) != 0 || 5 < (uint)subsamp)) {
      builtin_strncpy((char *)((long)handle + 0x618),"Invalid ",8);
      builtin_strncpy((char *)((long)handle + 0x620),"argument",8);
      builtin_strncpy((char *)((long)handle + 0x608),"tjEncode",8);
      builtin_strncpy((char *)((long)handle + 0x610),"YUV3(): ",8);
      *(undefined1 *)((long)handle + 0x628) = 0;
      *(undefined4 *)((long)handle + 0x6d0) = 1;
      *(undefined1 *)(in_FS_OFFSET + -0xb0) = 0;
      builtin_strncpy((char *)(in_FS_OFFSET + -0xc0),"Invalid ",8);
      builtin_strncpy((char *)(in_FS_OFFSET + -0xb8),"argument",8);
      builtin_strncpy((char *)(in_FS_OFFSET + -0xd0),"tjEncode",8);
      builtin_strncpy((char *)(in_FS_OFFSET + -200),"YUV3(): ",8);
      iVar1 = -1;
    }
    else {
      iVar1 = tjMCUWidth[(uint)subsamp];
      iVar2 = iVar1 + 7;
      if (-1 < iVar1) {
        iVar2 = iVar1;
      }
      iVar1 = tjMCUHeight[(uint)subsamp];
      local_58 = dstBuf;
      strides[0] = (pad + (-(iVar2 >> 3) & (width + (iVar2 >> 3)) - 1U)) - 1 & -pad;
      if (subsamp == 3) {
        strides[1] = 0;
        strides[2] = 0;
        local_50 = (uchar *)0x0;
        puStack_48 = (uchar *)0x0;
      }
      else {
        iVar2 = iVar1 + 7;
        if (-1 < iVar1) {
          iVar2 = iVar1;
        }
        local_38 = srcBuf;
        iVar1 = tjPlaneWidth(1,width,subsamp);
        local_40 = CONCAT44(extraout_var,iVar1);
        iVar1 = tjPlaneHeight(1,height,subsamp);
        strides[2] = (pad + (int)local_40) - 1U & -pad;
        strides[1] = strides[2];
        local_50 = local_58 +
                   (long)(int)(-(iVar2 >> 3) & (height + (iVar2 >> 3)) - 1U) * (long)strides[0];
        puStack_48 = local_50 + strides[2] * iVar1;
        srcBuf = local_38;
      }
      iVar1 = tjEncodeYUVPlanes(handle,srcBuf,width,pitch,height,pixelFormat,&local_58,strides,
                                subsamp,(int)dstPlanes[0]);
    }
    return iVar1;
  }
  builtin_strncpy((char *)(in_FS_OFFSET + -0xc1)," Invalid",8);
  builtin_strncpy((char *)(in_FS_OFFSET + -0xb9)," handle",8);
  builtin_strncpy((char *)(in_FS_OFFSET + -0xd0),"tjEncode",8);
  builtin_strncpy((char *)(in_FS_OFFSET + -200),"YUV3(): ",8);
  return -1;
}

Assistant:

DLLEXPORT int tjEncodeYUV3(tjhandle handle, const unsigned char *srcBuf,
                           int width, int pitch, int height, int pixelFormat,
                           unsigned char *dstBuf, int pad, int subsamp,
                           int flags)
{
  unsigned char *dstPlanes[3];
  int pw0, ph0, strides[3], retval = -1;
  tjinstance *this = (tjinstance *)handle;

  if (!this) THROWG("tjEncodeYUV3(): Invalid handle");
  this->isInstanceError = FALSE;

  if (width <= 0 || height <= 0 || dstBuf == NULL || pad < 0 ||
      !IS_POW2(pad) || subsamp < 0 || subsamp >= NUMSUBOPT)
    THROW("tjEncodeYUV3(): Invalid argument");

  pw0 = tjPlaneWidth(0, width, subsamp);
  ph0 = tjPlaneHeight(0, height, subsamp);
  dstPlanes[0] = dstBuf;
  strides[0] = PAD(pw0, pad);
  if (subsamp == TJSAMP_GRAY) {
    strides[1] = strides[2] = 0;
    dstPlanes[1] = dstPlanes[2] = NULL;
  } else {
    int pw1 = tjPlaneWidth(1, width, subsamp);
    int ph1 = tjPlaneHeight(1, height, subsamp);

    strides[1] = strides[2] = PAD(pw1, pad);
    dstPlanes[1] = dstPlanes[0] + strides[0] * ph0;
    dstPlanes[2] = dstPlanes[1] + strides[1] * ph1;
  }

  return tjEncodeYUVPlanes(handle, srcBuf, width, pitch, height, pixelFormat,
                           dstPlanes, strides, subsamp, flags);

bailout:
  return retval;
}